

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlink-ipi.c
# Opt level: O0

mraa_result_t gpio_wait_interrupt(int *fds,int num_fds,mraa_gpio_events_t events)

{
  int iVar1;
  long lVar2;
  pollfd *__fds;
  mraa_timestamp_t mVar3;
  nfds_t __nfds;
  undefined8 uStack_50;
  pollfd pStack_48;
  pollfd *local_40;
  ulong local_38;
  unsigned_long __vla_expr0;
  undefined1 local_21;
  mraa_gpio_events_t pmStack_20;
  uchar c;
  mraa_gpio_events_t events_local;
  int *piStack_10;
  int num_fds_local;
  int *fds_local;
  
  __vla_expr0 = (unsigned_long)&pStack_48;
  local_38 = (ulong)(uint)num_fds;
  lVar2 = -(local_38 * 8 + 0xf & 0xfffffffffffffff0);
  local_40 = (pollfd *)((long)&pStack_48 + lVar2);
  pmStack_20 = events;
  events_local._4_4_ = num_fds;
  piStack_10 = fds;
  local_40->fd = *fds;
  *(undefined2 *)((long)&pStack_48 + lVar2 + 4) = 2;
  iVar1 = *piStack_10;
  *(undefined8 *)((long)&uStack_50 + lVar2) = 0x14436b;
  lseek(iVar1,0,0);
  iVar1 = *piStack_10;
  *(undefined8 *)((long)&uStack_50 + lVar2) = 0x14437f;
  read(iVar1,&local_21,1);
  *(undefined8 *)((long)&uStack_50 + lVar2) = 0x144384;
  clear_sx1509x_intr();
  __fds = local_40;
  __nfds = (nfds_t)events_local._4_4_;
  *(undefined8 *)((long)&uStack_50 + lVar2) = 0x144396;
  poll(__fds,__nfds,-1);
  *(undefined8 *)((long)&uStack_50 + lVar2) = 0x14439b;
  clear_sx1509x_intr();
  if ((local_40->revents & 2U) == 0) {
    pmStack_20->id = -1;
  }
  else {
    iVar1 = *piStack_10;
    *(undefined8 *)((long)&uStack_50 + lVar2) = 0x1443bf;
    read(iVar1,&local_21,1);
    pmStack_20->id = 0;
    *(undefined8 *)((long)&uStack_50 + lVar2) = 0x1443ce;
    mVar3 = gpio_get_timestamp_sysfs();
    pmStack_20->timestamp = mVar3;
  }
  return MRAA_SUCCESS;
}

Assistant:

static mraa_result_t gpio_wait_interrupt(int fds[], int num_fds, mraa_gpio_events_t events)
{
	unsigned char c;
	struct pollfd pfd[num_fds];

	pfd[0].fd = fds[0];
	// setup poll on POLLPRI
	pfd[0].events = POLLPRI;

	// do an initial read to clear interrupt
	lseek(fds[0], 0, SEEK_SET);
	read(fds[0], &c, 1);

	clear_sx1509x_intr();

	// Wait for it forever or until pthread_cancel
	// poll is a cancelable point like sleep()
	poll(pfd, num_fds, -1);

	clear_sx1509x_intr();

	if (pfd[0].revents & POLLPRI) {
		read(fds[0], &c, 1);
		events[0].id = 0;
		events[0].timestamp = gpio_get_timestamp_sysfs();
	} else
		events[0].id = -1;

	return MRAA_SUCCESS;
}